

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkTimeInitialize(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkOld)

{
  Abc_ManTime_t *p;
  void **ppvVar1;
  Abc_Time_t *pAVar2;
  int iVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Abc_Time_t *pAVar6;
  int local_2c;
  int i;
  Abc_Time_t **ppTimes;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkOld_local;
  Abc_Ntk_t *pNtk_local;
  
  if ((pNtkOld != (Abc_Ntk_t *)0x0) && (pNtkOld->pManTime == (Abc_ManTime_t *)0x0)) {
    __assert_fail("pNtkOld == NULL || pNtkOld->pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                  ,0x156,"void Abc_NtkTimeInitialize(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld != (Abc_Ntk_t *)0x0) {
    iVar3 = Abc_NtkCiNum(pNtk);
    iVar4 = Abc_NtkCiNum(pNtkOld);
    if (iVar3 != iVar4) {
      __assert_fail("pNtkOld == NULL || Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x157,"void Abc_NtkTimeInitialize(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
  }
  if (pNtkOld != (Abc_Ntk_t *)0x0) {
    iVar3 = Abc_NtkCoNum(pNtk);
    iVar4 = Abc_NtkCoNum(pNtkOld);
    if (iVar3 != iVar4) {
      __assert_fail("pNtkOld == NULL || Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x158,"void Abc_NtkTimeInitialize(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
  }
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    p = pNtk->pManTime;
    iVar3 = Abc_NtkObjNumMax(pNtk);
    Abc_ManTimeExpand(p,iVar3,0);
    if (pNtkOld != (Abc_Ntk_t *)0x0) {
      pNtk->pManTime->tArrDef = pNtkOld->pManTime->tArrDef;
      pNtk->pManTime->tReqDef = pNtkOld->pManTime->tReqDef;
      pNtk->AndGateDelay = pNtkOld->AndGateDelay;
    }
    ppvVar1 = pNtk->pManTime->vArrs->pArray;
    for (local_2c = 0; iVar3 = Abc_NtkCiNum(pNtk), local_2c < iVar3; local_2c = local_2c + 1) {
      pAVar5 = Abc_NtkCi(pNtk,local_2c);
      pAVar2 = (Abc_Time_t *)ppvVar1[pAVar5->Id];
      if (pNtkOld == (Abc_Ntk_t *)0x0) {
        *pAVar2 = pNtk->pManTime->tArrDef;
      }
      else {
        pAVar5 = Abc_NtkCi(pNtkOld,local_2c);
        pAVar6 = Abc_NodeReadArrival(pAVar5);
        *pAVar2 = *pAVar6;
      }
    }
    ppvVar1 = pNtk->pManTime->vReqs->pArray;
    for (local_2c = 0; iVar3 = Abc_NtkCoNum(pNtk), local_2c < iVar3; local_2c = local_2c + 1) {
      pAVar5 = Abc_NtkCo(pNtk,local_2c);
      pAVar2 = (Abc_Time_t *)ppvVar1[pAVar5->Id];
      if (pNtkOld == (Abc_Ntk_t *)0x0) {
        *pAVar2 = pNtk->pManTime->tReqDef;
      }
      else {
        pAVar5 = Abc_NtkCo(pNtkOld,local_2c);
        pAVar6 = Abc_NodeReadRequired(pAVar5);
        *pAVar2 = *pAVar6;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkTimeInitialize( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkOld )
{
    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimes;
    int i;
    assert( pNtkOld == NULL || pNtkOld->pManTime != NULL );
    assert( pNtkOld == NULL || Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkOld) );
    assert( pNtkOld == NULL || Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkOld) );
    if ( pNtk->pManTime == NULL )
        return;
    // create timing manager with default values
    Abc_ManTimeExpand( pNtk->pManTime, Abc_NtkObjNumMax(pNtk), 0 );
    // set global defaults from pNtkOld
    if ( pNtkOld )
    {
        pNtk->pManTime->tArrDef = pNtkOld->pManTime->tArrDef;
        pNtk->pManTime->tReqDef = pNtkOld->pManTime->tReqDef;
        pNtk->AndGateDelay = pNtkOld->AndGateDelay;
    }
    // set the default timing for CI and COs
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vArrs->pArray;
    Abc_NtkForEachCi( pNtk, pObj, i )
        *ppTimes[pObj->Id] = pNtkOld ? *Abc_NodeReadArrival(Abc_NtkCi(pNtkOld, i)) : pNtk->pManTime->tArrDef;
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vReqs->pArray;
    Abc_NtkForEachCo( pNtk, pObj, i )
        *ppTimes[pObj->Id] = pNtkOld ? *Abc_NodeReadRequired(Abc_NtkCo(pNtkOld, i)) : pNtk->pManTime->tReqDef;
}